

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer *ppbVar1;
  pointer pbVar2;
  InternalRunDeathTestFlag *pIVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  pointer *pppcVar10;
  __sighandler_t p_Var11;
  long *plVar12;
  _func_void *p_Var13;
  ulong *puVar14;
  ulong *puVar15;
  size_type *psVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong *extraout_RDX_00;
  ulong *extraout_RDX_01;
  ulong *extraout_RDX_02;
  ulong *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  ulong uVar18;
  pointer pbVar19;
  long lVar20;
  pointer ppcVar21;
  undefined8 uVar22;
  ulong uVar23;
  const_iterator __position;
  size_t __len;
  _union_1457 local_310;
  sigaction ignore_sigprof_action;
  string filter_flag;
  long local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  size_type *local_238;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  undefined1 local_180 [8];
  ExecDeathTestArgs args_2;
  int local_15c;
  undefined1 auStack_158 [4];
  int death_test_index;
  Arguments args;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  undefined8 uStack_58;
  pointer *local_50;
  long local_48;
  pointer local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_15c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar5 = pipe(&local_138);
  if (iVar5 == -1) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar8;
    pppcVar10 = (pointer *)(puVar8 + 2);
    if (local_50 == pppcVar10) {
      local_40 = *pppcVar10;
      lStack_38 = puVar8[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar10;
    }
    local_48 = puVar8[1];
    *puVar8 = pppcVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*plVar7;
    puVar15 = (ulong *)(plVar7 + 2);
    if (local_90 == puVar15) {
      local_80 = *puVar15;
      lStack_78 = plVar7[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar15;
    }
    local_88 = plVar7[1];
    *plVar7 = (long)puVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_110._M_dataplus._M_p._0_4_ = 0x589;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar23 = 0xf;
    if (local_90 != &local_80) {
      uVar23 = local_80;
    }
    if (uVar23 < local_d0._M_string_length + local_88) {
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar22 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_d0._M_string_length + local_88) goto LAB_00125476;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00125476:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar8;
    puVar15 = puVar8 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar15) {
      local_b0.field_2._M_allocated_capacity = *puVar15;
      local_b0.field_2._8_8_ = puVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar15;
    }
    local_b0._M_string_length = puVar8[1];
    *puVar8 = puVar15;
    puVar8[1] = 0;
    *(undefined1 *)puVar15 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_310.sa_handler = (__sighandler_t)*plVar7;
    p_Var11 = (__sighandler_t)(plVar7 + 2);
    if (local_310.sa_handler == p_Var11) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
      ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
    *plVar7 = (long)p_Var11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    internal_flag.field_2._8_8_ = *puVar8;
    puVar15 = puVar8 + 2;
    if ((ulong *)internal_flag.field_2._8_8_ == puVar15) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar15;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar15;
    }
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
    *puVar8 = puVar15;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
    puVar8 = extraout_RAX_02;
    internal_flag.field_2._8_8_ = extraout_RDX_02;
LAB_00125e75:
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar15;
  }
  else {
    iVar5 = fcntl(local_134,2,0);
    if (iVar5 != -1) {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      pppcVar10 = (pointer *)(plVar7 + 2);
      if ((pointer *)*plVar7 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
        local_50 = (pointer *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)pppcVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar15 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar15) {
        local_80 = *puVar15;
        lStack_78 = plVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar15;
        local_90 = (ulong *)*plVar7;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)puVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar16 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_b0.field_2._M_allocated_capacity = *psVar16;
        local_b0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar16;
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar16;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var11 = (__sighandler_t)(plVar7 + 2);
      if ((__sighandler_t)*plVar7 == p_Var11) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
        ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
        local_310.sa_handler = (__sighandler_t)*plVar7;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
      *plVar7 = (long)p_Var11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar12;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar7[3];
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar12;
        internal_flag.field_2._8_8_ = (long *)*plVar7;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(internal_flag.field_2._M_local_buf + 8);
      ignore_sigprof_action.sa_restorer = (_func_void *)&filter_flag._M_string_length;
      p_Var13 = (_func_void *)(plVar7 + 2);
      if ((_func_void *)*plVar7 == p_Var13) {
        filter_flag._M_string_length = *(size_type *)p_Var13;
        filter_flag.field_2._M_allocated_capacity = plVar7[3];
      }
      else {
        filter_flag._M_string_length = *(size_type *)p_Var13;
        ignore_sigprof_action.sa_restorer = (_func_void *)*plVar7;
      }
      filter_flag._M_dataplus._M_p = (pointer)plVar7[1];
      *plVar7 = (long)p_Var13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,(long)local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      pipe_fd = (int  [2])&local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)pipe_fd);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      puVar15 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_f0.field_2._M_allocated_capacity = *puVar15;
        local_f0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar15;
        local_f0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar12 = plVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_110.field_2._M_allocated_capacity = *plVar12;
        local_110.field_2._8_8_ = plVar7[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *plVar12;
        local_110._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_110._M_string_length = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
      puVar15 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_d0.field_2._M_allocated_capacity = *puVar15;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar15;
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      puVar15 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar15) {
        local_60 = *puVar15;
        uStack_58 = puVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar15;
        local_70 = (ulong *)*puVar8;
      }
      local_68 = puVar8[1];
      *puVar8 = puVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      pppcVar10 = (pointer *)(plVar7 + 2);
      if ((pointer *)*plVar7 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
        local_50 = (pointer *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)pppcVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>((string *)auStack_158,&this->line_);
      ppcVar21 = (pointer)0xf;
      if (local_50 != &local_40) {
        ppcVar21 = local_40;
      }
      if (ppcVar21 <
          (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start + local_48)) {
        ppcVar21 = (pointer)0xf;
        if ((pointer *)_auStack_158 !=
            &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          ppcVar21 = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        if (ppcVar21 <
            (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start + local_48)) goto LAB_00124059;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)auStack_158,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_00124059:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_50,(ulong)_auStack_158);
      }
      local_90 = &local_80;
      puVar15 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar15) {
        local_80 = *puVar15;
        lStack_78 = puVar8[3];
      }
      else {
        local_80 = *puVar15;
        local_90 = (ulong *)*puVar8;
      }
      local_88 = puVar8[1];
      *puVar8 = puVar15;
      puVar8[1] = 0;
      *(undefined1 *)puVar15 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      puVar15 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_b0.field_2._M_allocated_capacity = *puVar15;
        local_b0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar15;
        local_b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_b0._M_string_length = puVar8[1];
      *puVar8 = puVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      StreamableToString<int>((string *)local_180,&local_15c);
      uVar23 = CONCAT44(args_2.argv._4_4_,(int)args_2.argv) + local_b0._M_string_length;
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar22 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < uVar23) {
        uVar18 = 0xf;
        if (local_180 != (undefined1  [8])&args_2.close_fd) {
          uVar18 = args_2._8_8_;
        }
        if (uVar18 < uVar23) goto LAB_0012418e;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)local_180,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_0012418e:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_180);
      }
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var11 = (__sighandler_t)(puVar8 + 2);
      if ((__sighandler_t)*puVar8 == p_Var11) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
        ignore_sigprof_action.sa_mask.__val[1] = puVar8[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
        local_310.sa_handler = (__sighandler_t)*puVar8;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(puVar8 + 1);
      *puVar8 = p_Var11;
      puVar8[1] = 0;
      *p_Var11 = (__sighandler_t)0x0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar12;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar7[3];
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar12;
        internal_flag.field_2._8_8_ = (long *)*plVar7;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>((string *)((long)&filter_flag.field_2 + 8),&local_134);
      pbVar2 = (pointer)((long)&((args_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        local_250);
      pbVar19 = (pointer)0xf;
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar19 = args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pbVar19 < pbVar2) {
        uVar22 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_) != &local_248) {
          uVar22 = local_248._M_allocated_capacity;
        }
        if ((ulong)uVar22 < pbVar2) goto LAB_001242cf;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)((long)&filter_flag.field_2 + 8),0,(char *)0x0,
                            internal_flag.field_2._8_8_);
      }
      else {
LAB_001242cf:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (internal_flag.field_2._M_local_buf + 8,
                            CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_));
      }
      local_238 = &internal_flag._M_string_length;
      psVar16 = puVar8 + 2;
      if ((size_type *)*puVar8 == psVar16) {
        internal_flag._M_string_length = *psVar16;
        internal_flag.field_2._M_allocated_capacity = puVar8[3];
      }
      else {
        internal_flag._M_string_length = *psVar16;
        local_238 = (size_type *)*puVar8;
      }
      internal_flag._M_dataplus._M_p = (pointer)puVar8[1];
      *puVar8 = psVar16;
      puVar8[1] = 0;
      *(undefined1 *)psVar16 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_) != &local_248) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_),
                        (ulong)(local_248._M_allocated_capacity + 1));
      }
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if (local_180 != (undefined1  [8])&args_2.close_fd) {
        operator_delete((void *)local_180,args_2._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((pointer *)_auStack_158 !=
          &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_158,
                        (long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                              .super__Vector_impl_data._M_finish + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,(long)local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (pipe_fd != (int  [2])&local_120) {
        operator_delete((void *)pipe_fd,local_120._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)auStack_158);
      GetInjectableArgvs_abi_cxx11_();
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&internal_flag.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&internal_flag.field_2 + 8));
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      internal_flag.field_2._8_8_ = strdup((char *)ignore_sigprof_action.sa_restorer);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,__position,
                 (value_type *)((long)&internal_flag.field_2 + 8));
      ppbVar1 = &args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      internal_flag.field_2._8_8_ = strdup((char *)local_238);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1),
                 (value_type *)((long)&internal_flag.field_2 + 8));
      internal_flag.field_2._8_8_ = ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&internal_flag.field_2 + 8),"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((pointer *)internal_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_180 = (undefined1  [8])_auStack_158;
      args_2.argv._0_4_ = local_138;
      memset(&local_310,0,0x98);
      sigemptyset((sigset_t *)&ignore_sigprof_action);
      local_310 = (_union_1457)0x1;
      do {
        iVar5 = sigaction(0x1b,(sigaction *)&local_310,
                          (sigaction *)((long)&internal_flag.field_2 + 8));
        cVar4 = FLAGS_gtest_death_test_use_fork;
        if (iVar5 != -1) {
          iVar5 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            iVar5 = getpagesize();
            __len = (size_t)(iVar5 * 2);
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,"CHECK failed: File ","");
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
              local_d0._M_dataplus._M_p = (pointer)*puVar8;
              puVar15 = puVar8 + 2;
              if ((ulong *)local_d0._M_dataplus._M_p == puVar15) {
                local_d0.field_2._M_allocated_capacity = *puVar15;
                local_d0.field_2._8_8_ = puVar8[3];
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              }
              else {
                local_d0.field_2._M_allocated_capacity = *puVar15;
              }
              local_d0._M_string_length = puVar8[1];
              *puVar8 = puVar15;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
              local_70 = &local_60;
              puVar15 = (ulong *)*puVar8;
              puVar14 = puVar8 + 2;
              if (puVar15 != puVar14) goto LAB_00125799;
              local_60 = *puVar14;
              uStack_58 = puVar8[3];
              goto LAB_001257a4;
            }
            lVar20 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar20 = __len - 0x40;
            }
            if ((0x40 < (uint)(iVar5 * 2)) && (((ulong)(lVar20 + (long)__addr) & 0x3f) == 0)) {
              iVar5 = clone(ExecDeathTestChildMain,(void *)(lVar20 + (long)__addr),0x11,local_180);
              iVar6 = munmap(__addr,__len);
              if (iVar6 != -1) goto LAB_00124759;
              goto LAB_00124e39;
            }
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"CHECK failed: File ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
            puVar15 = puVar8 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar15) {
              local_d0.field_2._M_allocated_capacity = *puVar15;
              local_d0.field_2._8_8_ = puVar8[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar15;
            }
            local_d0._M_string_length = puVar8[1];
            *puVar8 = puVar15;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = (ulong *)*puVar8;
            puVar15 = puVar8 + 2;
            if (local_70 == puVar15) {
              local_60 = *puVar15;
              uStack_58 = puVar8[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *puVar15;
            }
            local_68 = puVar8[1];
            *puVar8 = puVar15;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            pipe_fd[0] = 0x560;
            StreamableToString<int>(&local_f0,pipe_fd);
            uVar23 = 0xf;
            if (local_70 != &local_60) {
              uVar23 = local_60;
            }
            if (uVar23 < local_f0._M_string_length + local_68) {
              uVar22 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                uVar22 = local_f0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar22 < local_f0._M_string_length + local_68) goto LAB_001258c2;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70)
              ;
            }
            else {
LAB_001258c2:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
            }
            local_50 = (pointer *)*puVar8;
            pppcVar10 = (pointer *)(puVar8 + 2);
            if (local_50 == pppcVar10) {
              local_40 = *pppcVar10;
              lStack_38 = puVar8[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *pppcVar10;
            }
            local_48 = puVar8[1];
            *puVar8 = pppcVar10;
            puVar8[1] = 0;
            *(undefined1 *)pppcVar10 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
            local_90 = (ulong *)*puVar8;
            puVar15 = puVar8 + 2;
            if (local_90 == puVar15) {
              local_80 = *puVar15;
              lStack_78 = puVar8[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar15;
            }
            local_88 = puVar8[1];
            *puVar8 = puVar15;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
            psVar16 = puVar8 + 2;
            if (paVar17 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) goto LAB_00126052;
            local_b0.field_2._M_allocated_capacity = *psVar16;
            local_b0.field_2._8_8_ = puVar8[3];
            goto LAB_00126063;
          }
LAB_00124759:
          if ((cVar4 == '\0') || (iVar5 = fork(), iVar5 != 0)) {
            goto LAB_00124775;
          }
          ExecDeathTestChildMain(local_180);
LAB_00124e39:
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"CHECK failed: File ","");
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          local_d0._M_dataplus._M_p = (pointer)*puVar8;
          puVar15 = puVar8 + 2;
          if ((ulong *)local_d0._M_dataplus._M_p == puVar15) {
            local_d0.field_2._M_allocated_capacity = *puVar15;
            local_d0.field_2._8_8_ = puVar8[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar15;
          }
          local_d0._M_string_length = puVar8[1];
          *puVar8 = puVar15;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
          local_70 = (ulong *)*puVar8;
          puVar15 = puVar8 + 2;
          if (local_70 == puVar15) {
            local_60 = *puVar15;
            uStack_58 = puVar8[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *puVar15;
          }
          local_68 = puVar8[1];
          *puVar8 = puVar15;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          pipe_fd[0] = 0x564;
          StreamableToString<int>(&local_f0,pipe_fd);
          uVar23 = 0xf;
          if (local_70 != &local_60) {
            uVar23 = local_60;
          }
          if (uVar23 < local_f0._M_string_length + local_68) {
            uVar22 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar22 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar22 < local_f0._M_string_length + local_68) goto LAB_00125961;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_00125961:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
          }
          local_50 = (pointer *)*puVar8;
          pppcVar10 = (pointer *)(puVar8 + 2);
          if (local_50 == pppcVar10) {
            local_40 = *pppcVar10;
            lStack_38 = puVar8[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *pppcVar10;
          }
          local_48 = puVar8[1];
          *puVar8 = pppcVar10;
          puVar8[1] = 0;
          *(undefined1 *)pppcVar10 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          local_90 = (ulong *)*puVar8;
          puVar15 = puVar8 + 2;
          if (local_90 == puVar15) {
            local_80 = *puVar15;
            lStack_78 = puVar8[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *puVar15;
          }
          local_88 = puVar8[1];
          *puVar8 = puVar15;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
          psVar16 = puVar8 + 2;
          if (paVar17 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) goto LAB_00126086;
          local_b0.field_2._M_allocated_capacity = *psVar16;
          local_b0.field_2._8_8_ = puVar8[3];
          goto LAB_00126097;
        }
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110._M_dataplus._M_p = (pointer)*plVar7;
      plVar12 = plVar7 + 2;
      if ((long *)local_110._M_dataplus._M_p == plVar12) {
        local_110.field_2._M_allocated_capacity = *plVar12;
        local_110.field_2._8_8_ = plVar7[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *plVar12;
      }
      local_110._M_string_length = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
      puVar15 = (ulong *)(plVar7 + 2);
      if ((ulong *)local_d0._M_dataplus._M_p == puVar15) {
        local_d0.field_2._M_allocated_capacity = *puVar15;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar15;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      filter_flag.field_2._8_4_ = 0x546;
      StreamableToString<int>((string *)pipe_fd,(int *)(filter_flag.field_2._M_local_buf + 8));
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar22 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_128 + local_d0._M_string_length) {
        uVar22 = 0xf;
        if (pipe_fd != (int  [2])&local_120) {
          uVar22 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar22 < local_128 + local_d0._M_string_length) goto LAB_00124acb;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
      }
      else {
LAB_00124acb:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
      }
      local_70 = (ulong *)*puVar8;
      puVar15 = puVar8 + 2;
      if (local_70 == puVar15) {
        local_60 = *puVar15;
        uStack_58 = puVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar15;
      }
      local_68 = puVar8[1];
      *puVar8 = puVar15;
      puVar8[1] = 0;
      *(undefined1 *)puVar15 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (pointer *)*puVar8;
      pppcVar10 = (pointer *)(puVar8 + 2);
      if (local_50 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = puVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
      }
      local_48 = puVar8[1];
      *puVar8 = pppcVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*puVar8;
      puVar15 = puVar8 + 2;
      if (local_90 == puVar15) {
        local_80 = *puVar15;
        lStack_78 = puVar8[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar15;
      }
      local_88 = puVar8[1];
      *puVar8 = puVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*puVar8;
      puVar14 = puVar8 + 2;
      if ((ulong *)local_b0._M_dataplus._M_p == puVar14) {
        local_b0.field_2._M_allocated_capacity = *puVar14;
        local_b0.field_2._8_8_ = puVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar14;
      }
      local_b0._M_string_length = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar8 = extraout_RAX;
      paVar17 = extraout_RDX;
      goto LAB_00125731;
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar8;
    pppcVar10 = (pointer *)(puVar8 + 2);
    if (local_50 == pppcVar10) {
      local_40 = *pppcVar10;
      lStack_38 = puVar8[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar10;
    }
    local_48 = puVar8[1];
    *puVar8 = pppcVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*puVar8;
    puVar15 = puVar8 + 2;
    if (local_90 == puVar15) {
      local_80 = *puVar15;
      lStack_78 = puVar8[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar15;
    }
    local_88 = puVar8[1];
    *puVar8 = puVar15;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_110._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar23 = 0xf;
    if (local_90 != &local_80) {
      uVar23 = local_80;
    }
    if (uVar23 < local_d0._M_string_length + local_88) {
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar22 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_d0._M_string_length + local_88) goto LAB_00125517;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00125517:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar8;
    puVar15 = puVar8 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar15) {
      local_b0.field_2._M_allocated_capacity = *puVar15;
      local_b0.field_2._8_8_ = puVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar15;
    }
    local_b0._M_string_length = puVar8[1];
    *puVar8 = puVar15;
    puVar8[1] = 0;
    *(undefined1 *)puVar15 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_310.sa_handler = (__sighandler_t)*plVar7;
    p_Var11 = (__sighandler_t)(plVar7 + 2);
    if (local_310.sa_handler == p_Var11) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
      ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
    *plVar7 = (long)p_Var11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    internal_flag.field_2._8_8_ = *puVar8;
    puVar15 = puVar8 + 2;
    if ((ulong *)internal_flag.field_2._8_8_ != puVar15) goto LAB_00125e75;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar15;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
    internal_flag.field_2._8_8_ =
         &args_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  puVar8 = extraout_RAX_03;
  local_90 = extraout_RDX_03;
  goto LAB_00125ea9;
LAB_00124807:
  do {
    iVar6 = close(local_134);
    if (iVar6 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar5;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)auStack_158);
      if (local_238 != &internal_flag._M_string_length) {
        operator_delete(local_238,internal_flag._M_string_length + 1);
      }
      if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
        operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = (ulong *)*puVar8;
  puVar15 = puVar8 + 2;
  if (local_70 == puVar15) {
    local_60 = *puVar15;
    uStack_58 = puVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar15;
  }
  local_68 = puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*plVar7;
  pppcVar10 = (pointer *)(plVar7 + 2);
  if (local_50 == pppcVar10) {
    local_40 = *pppcVar10;
    lStack_38 = plVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar10;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)pppcVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_f0._M_dataplus._M_p._0_4_ = 0x5a3;
  StreamableToString<int>(&local_110,(int *)&local_f0);
  ppcVar21 = (pointer)0xf;
  if (local_50 != &local_40) {
    ppcVar21 = local_40;
  }
  if (ppcVar21 < (pointer)(local_110._M_string_length + local_48)) {
    uVar22 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar22 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < (pointer)(local_110._M_string_length + local_48)) goto LAB_00124c24;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_00124c24:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_110._M_dataplus._M_p);
  }
  local_90 = (ulong *)*puVar8;
  puVar15 = puVar8 + 2;
  if (local_90 == puVar15) {
    local_80 = *puVar15;
    lStack_78 = puVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar15;
  }
  local_88 = puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)puVar15 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar8;
  puVar15 = puVar8 + 2;
  if ((ulong *)local_b0._M_dataplus._M_p == puVar15) {
    local_b0.field_2._M_allocated_capacity = *puVar15;
    local_b0.field_2._8_8_ = puVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar15;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_310.sa_handler = (__sighandler_t)*plVar7;
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if (local_310.sa_handler == p_Var11) {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
    ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
    local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var11;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  internal_flag.field_2._8_8_ =
       &args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (puVar15 != puVar14) goto LAB_00125765;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
  goto LAB_00125776;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_00124775:
    iVar6 = sigaction(0x1b,(sigaction *)((long)&internal_flag.field_2 + 8),(sigaction *)0x0);
    if (iVar6 != -1) {
      if (iVar5 != -1) goto LAB_00124807;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_d0._M_dataplus._M_p = (pointer)*puVar8;
      puVar15 = puVar8 + 2;
      if ((ulong *)local_d0._M_dataplus._M_p == puVar15) {
        local_d0.field_2._M_allocated_capacity = *puVar15;
        local_d0.field_2._8_8_ = puVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar15;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = puVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      local_70 = (ulong *)*puVar8;
      puVar15 = puVar8 + 2;
      if (local_70 == puVar15) {
        local_60 = *puVar15;
        uStack_58 = puVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar15;
      }
      local_68 = puVar8[1];
      *puVar8 = puVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      pipe_fd[0] = 0x574;
      StreamableToString<int>(&local_f0,pipe_fd);
      uVar23 = 0xf;
      if (local_70 != &local_60) {
        uVar23 = local_60;
      }
      if (uVar23 < local_f0._M_string_length + local_68) {
        uVar22 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          uVar22 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar22 < local_f0._M_string_length + local_68) goto LAB_001256e8;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70);
      }
      else {
LAB_001256e8:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_f0._M_dataplus._M_p)
        ;
      }
      local_50 = (pointer *)*puVar8;
      pppcVar10 = (pointer *)(puVar8 + 2);
      if (local_50 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = puVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
      }
      local_48 = puVar8[1];
      *puVar8 = pppcVar10;
      puVar8[1] = 0;
      *(undefined1 *)pppcVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*plVar7;
      puVar15 = (ulong *)(plVar7 + 2);
      if (local_90 == puVar15) {
        local_80 = *puVar15;
        lStack_78 = plVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar15;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)puVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
      psVar16 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar16) {
        local_b0.field_2._M_allocated_capacity = *psVar16;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar16;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar16;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar8 = extraout_RAX_04;
      local_b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0012601e;
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  local_110._M_dataplus._M_p = (pointer)*puVar8;
  plVar7 = puVar8 + 2;
  if ((long *)local_110._M_dataplus._M_p == plVar7) {
    local_110.field_2._M_allocated_capacity = *plVar7;
    local_110.field_2._8_8_ = puVar8[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *plVar7;
  }
  local_110._M_string_length = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_d0._M_dataplus._M_p = (pointer)*puVar8;
  puVar15 = puVar8 + 2;
  if ((ulong *)local_d0._M_dataplus._M_p == puVar15) {
    local_d0.field_2._M_allocated_capacity = *puVar15;
    local_d0.field_2._8_8_ = puVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar15;
  }
  local_d0._M_string_length = puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  filter_flag.field_2._8_4_ = 0x571;
  StreamableToString<int>((string *)pipe_fd,(int *)(filter_flag.field_2._M_local_buf + 8));
  uVar22 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar22 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_128 + local_d0._M_string_length) {
    uVar22 = 0xf;
    if (pipe_fd != (int  [2])&local_120) {
      uVar22 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_128 + local_d0._M_string_length) goto LAB_00124b82;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_00124b82:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
  }
  local_70 = (ulong *)*puVar8;
  puVar15 = puVar8 + 2;
  if (local_70 == puVar15) {
    local_60 = *puVar15;
    uStack_58 = puVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar15;
  }
  local_68 = puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)puVar15 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*puVar8;
  pppcVar10 = (pointer *)(puVar8 + 2);
  if (local_50 == pppcVar10) {
    local_40 = *pppcVar10;
    lStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar10;
  }
  local_48 = puVar8[1];
  *puVar8 = pppcVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar8;
  puVar15 = puVar8 + 2;
  if (local_90 == puVar15) {
    local_80 = *puVar15;
    lStack_78 = puVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar15;
  }
  local_88 = puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8;
  puVar14 = puVar8 + 2;
  if (paVar17 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_b0.field_2._M_allocated_capacity = *puVar14;
    local_b0.field_2._8_8_ = puVar8[3];
  }
  else {
LAB_00125731:
    local_b0.field_2._M_allocated_capacity = *puVar14;
    local_b0._M_dataplus._M_p = (pointer)paVar17;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_00;
  puVar15 = extraout_RDX_00;
LAB_00125765:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
  internal_flag.field_2._8_8_ = puVar15;
LAB_00125776:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  puVar8 = extraout_RAX_01;
  puVar15 = extraout_RDX_01;
LAB_00125799:
  local_60 = *puVar14;
  local_70 = puVar15;
LAB_001257a4:
  local_68 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  pipe_fd[0] = 0x552;
  StreamableToString<int>(&local_f0,pipe_fd);
  uVar23 = 0xf;
  if (local_70 != &local_60) {
    uVar23 = local_60;
  }
  if (uVar23 < local_f0._M_string_length + local_68) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar22 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_f0._M_string_length + local_68) goto LAB_00125823;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00125823:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
  }
  local_50 = (pointer *)*puVar8;
  pppcVar10 = (pointer *)(puVar8 + 2);
  if (local_50 == pppcVar10) {
    local_40 = *pppcVar10;
    lStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar10;
  }
  local_48 = puVar8[1];
  *puVar8 = pppcVar10;
  puVar8[1] = 0;
  *(undefined1 *)pppcVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar8;
  puVar15 = puVar8 + 2;
  if (local_90 == puVar15) {
    local_80 = *puVar15;
    lStack_78 = puVar8[3];
    local_90 = &local_80;
  }
  else {
LAB_00125ea9:
    local_80 = *puVar15;
  }
  local_88 = puVar8[1];
  *puVar8 = puVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar8;
  psVar16 = puVar8 + 2;
  if ((size_type *)local_b0._M_dataplus._M_p == psVar16) {
    local_b0.field_2._M_allocated_capacity = *psVar16;
    local_b0.field_2._8_8_ = puVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
LAB_0012601e:
    local_b0.field_2._M_allocated_capacity = *psVar16;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = psVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_05;
  paVar17 = extraout_RDX_05;
LAB_00126052:
  local_b0.field_2._M_allocated_capacity = *psVar16;
  local_b0._M_dataplus._M_p = (pointer)paVar17;
LAB_00126063:
  local_b0._M_string_length = puVar8[1];
  *puVar8 = psVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_06;
  paVar17 = extraout_RDX_06;
LAB_00126086:
  local_b0.field_2._M_allocated_capacity = *psVar16;
  local_b0._M_dataplus._M_p = (pointer)paVar17;
LAB_00126097:
  local_b0._M_string_length = puVar8[1];
  *puVar8 = psVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,(long)local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)auStack_158);
  if (local_238 != &internal_flag._M_string_length) {
    operator_delete(local_238,internal_flag._M_string_length + 1);
  }
  if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
    operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}